

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

Element __thiscall ftxui::TabContainer::Render(TabContainer *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  Element EVar3;
  allocator<char> local_59;
  string local_58;
  undefined4 local_38;
  undefined1 local_28 [8];
  Component active_child;
  TabContainer *this_local;
  
  (**(code **)(*in_RSI + 0x20))(local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    (*peVar2->_vptr_ComponentBase[2])(this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Empty container",&local_59);
    text((ftxui *)this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  local_38 = 1;
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr((shared_ptr<ftxui::ComponentBase> *)local_28);
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    Component active_child = ActiveChild();
    if (active_child)
      return active_child->Render();
    return text("Empty container");
  }